

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O2

ulint __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::sumOfHeights
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this)

{
  size_t sVar1;
  uint i;
  ulong uVar2;
  long lVar3;
  ulint uVar4;
  info_t local_d0;
  info_t local_80;
  
  if (this->unary_string == false) {
    lVar3 = 0;
    uVar4 = 0;
    for (uVar2 = 0; uVar2 < this->number_of_internal_nodes; uVar2 = uVar2 + 1) {
      bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::info
                (&local_80,
                 (bitvector_t<4096UL,_(bv::allocation_policy_t)0> *)
                 ((long)&(((this->wavelet_tree).
                           super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_impl)._M_t.
                         super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                 + lVar3));
      sVar1 = local_80.capacity;
      bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::info
                (&local_d0,
                 (bitvector_t<4096UL,_(bv::allocation_policy_t)0> *)
                 ((long)&(((this->wavelet_tree).
                           super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_impl)._M_t.
                         super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                 + lVar3));
      lVar3 = lVar3 + 8;
      uVar4 = uVar4 + (local_d0.height + 1) * sVar1;
    }
  }
  else {
    uVar4 = this->n;
  }
  return uVar4;
}

Assistant:

ulint  sumOfHeights(){//sum of the heights of all bitvectors' B-trees (each multiplied by the length of the bitvector)

		if(unary_string)
			return n;

		ulint tot=0;

		for(uint i=0;i<number_of_internal_nodes;i++)
			//tot += wavelet_tree[i].maxSize()*wavelet_tree[i].height();
			tot += wavelet_tree[i].info().capacity * (wavelet_tree[i].info().height+1);//sum 1 because in bitvector heights start from 0

		return tot;

	}